

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall test_unary::grad_expect(test_unary *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  long in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  allocator_type *in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff90;
  float fVar1;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 uVar2;
  iterator in_stack_ffffffffffffff98;
  iterator pfVar3;
  size_type in_stack_ffffffffffffffa0;
  size_type sVar4;
  undefined4 local_54;
  undefined4 *local_50;
  undefined8 local_48;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 *local_20;
  undefined8 local_18;
  
  if (*(int *)(in_RSI + 0x38) == 0) {
    local_28 = 0xbf800000;
    local_24 = 0x3f800000;
    local_20 = &local_28;
    local_18 = 2;
    std::allocator<float>::allocator((allocator<float> *)0x17f95c);
    __l._M_len = in_stack_ffffffffffffffa0;
    __l._M_array = in_stack_ffffffffffffff98;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),__l,
               in_stack_ffffffffffffff88);
    std::allocator<float>::~allocator((allocator<float> *)0x17f987);
  }
  else if ((*(int *)(in_RSI + 0x38) == 1) || (*(int *)(in_RSI + 0x38) == 3)) {
    local_54 = 0;
    local_50 = &local_54;
    local_48 = 1;
    std::allocator<float>::allocator((allocator<float> *)0x17f9e9);
    __l_00._M_len = in_stack_ffffffffffffffa0;
    __l_00._M_array = in_stack_ffffffffffffff98;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),__l_00,
               in_stack_ffffffffffffff88);
    std::allocator<float>::~allocator((allocator<float> *)0x17fa0e);
  }
  else if (*(int *)(in_RSI + 0x38) == 6) {
    fVar1 = 0.0;
    uVar2 = 0x3f800000;
    pfVar3 = (iterator)&stack0xffffffffffffff90;
    sVar4 = 2;
    std::allocator<float>::allocator((allocator<float> *)0x17fa6c);
    __l_01._M_len = sVar4;
    __l_01._M_array = pfVar3;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)CONCAT44(uVar2,fVar1),__l_01,
               in_stack_ffffffffffffff88);
    std::allocator<float>::~allocator((allocator<float> *)0x17fa90);
  }
  else {
    memset(in_RDI,0,0x18);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x17fac7);
  }
  return in_RDI;
}

Assistant:

std::vector<float> grad_expect() override {
        if (op == GGML_UNARY_OP_ABS) {
            return {-1.0f, 1.0f};
        }
        if (op == GGML_UNARY_OP_SGN || op == GGML_UNARY_OP_STEP) {
            return {0.0f};
        }
        if (op == GGML_UNARY_OP_RELU) {
            return {0.0f, 1.0f};
        }
        return {};
    }